

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O0

void __thiscall
UnifiedRegex::
SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
::SyncToLiteralAndContinueInstT
          (SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
           *this,InstTag tag,CharCount offset,CharCount length)

{
  CharCount length_local;
  CharCount offset_local;
  InstTag tag_local;
  SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
  *this_local;
  
  Inst::Inst(&this->super_Inst,tag);
  ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>::ScannerMixinT
            (&this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>,
             offset,length);
  return;
}

Assistant:

SyncToLiteralAndContinueInstT(InstTag tag, CharCount offset, CharCount length) : Inst(tag), ScannerT(offset, length) {}